

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O2

void randomx_calculate_hash_next
               (randomx_vm *machine,void *nextInput,size_t nextInputSize,void *output)

{
  uint64_t *out;
  int iVar1;
  bool bVar2;
  
  randomx_vm::resetRoundingMode(machine);
  out = machine->tempHash;
  iVar1 = 7;
  while( true ) {
    (*machine->_vptr_randomx_vm[8])(machine,out);
    bVar2 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar2) break;
    randomx_blake2b(out,0x40,&machine->reg,0x100,(void *)0x0,0);
  }
  randomx_blake2b(out,0x40,nextInput,nextInputSize,(void *)0x0,0);
  (*machine->_vptr_randomx_vm[4])(machine,output,0x20,out);
  return;
}

Assistant:

void randomx_calculate_hash_next(randomx_vm* machine, const void* nextInput, size_t nextInputSize, void* output) {
		machine->resetRoundingMode();
		for (uint32_t chain = 0; chain < RANDOMX_PROGRAM_COUNT - 1; ++chain) {
			machine->run(machine->tempHash);
			blake2b(machine->tempHash, sizeof(machine->tempHash), machine->getRegisterFile(), sizeof(randomx::RegisterFile), nullptr, 0);
		}
		machine->run(machine->tempHash);

		// Finish current hash and fill the scratchpad for the next hash at the same time
		blake2b(machine->tempHash, sizeof(machine->tempHash), nextInput, nextInputSize, nullptr, 0);
		machine->hashAndFill(output, RANDOMX_HASH_SIZE, machine->tempHash);
	}